

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O0

WORD32 ihevcd_parse_pred_wt_ofst
                 (bitstrm_t *ps_bitstrm,sps_t *ps_sps,pps_t *ps_pps,slice_header_t *ps_slice_hdr)

{
  UWORD32 UVar1;
  WORD32 WVar2;
  int iVar3;
  byte *pbVar4;
  long in_RCX;
  long in_RSI;
  bitstrm_t *in_RDI;
  WORD32 shift_1;
  WORD32 ofst_1;
  WORD32 shift;
  WORD32 ofst;
  pred_wt_ofst_t *ps_wt_ofst;
  WORD32 i;
  WORD32 value;
  IHEVCD_ERROR_T ret;
  int local_68;
  undefined2 local_64;
  int local_60;
  undefined2 local_5c;
  int local_58;
  undefined2 local_54;
  undefined4 in_stack_ffffffffffffffb0;
  undefined2 uVar5;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_2c;
  
  pbVar4 = (byte *)(in_RCX + 0x10e);
  UVar1 = ihevcd_uev((bitstrm_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  *pbVar4 = (byte)UVar1;
  if (*(char *)(in_RSI + 0xf) != '\0') {
    WVar2 = ihevcd_sev((bitstrm_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    *(byte *)(in_RCX + 0x10f) = *pbVar4 + (char)WVar2;
  }
  for (local_2c = 0; local_2c < *(char *)(in_RCX + 0xa4); local_2c = local_2c + 1) {
    UVar1 = ihevcd_bits_get(in_RDI,1);
    *(char *)(in_RCX + 0x110 + (long)local_2c) = (char)UVar1;
  }
  if (*(char *)(in_RSI + 0xf) == '\0') {
    for (local_2c = 0; local_2c < *(char *)(in_RCX + 0xa4); local_2c = local_2c + 1) {
      *(undefined1 *)(in_RCX + 0x120 + (long)local_2c) = 0;
    }
  }
  else {
    for (local_2c = 0; local_2c < *(char *)(in_RCX + 0xa4); local_2c = local_2c + 1) {
      UVar1 = ihevcd_bits_get(in_RDI,1);
      *(char *)(in_RCX + 0x120 + (long)local_2c) = (char)UVar1;
    }
  }
  for (local_2c = 0; local_2c < *(char *)(in_RCX + 0xa4); local_2c = local_2c + 1) {
    if (*(char *)(in_RCX + 0x110 + (long)local_2c) == '\0') {
      *(short *)(in_RCX + 0x130 + (long)local_2c * 2) = (short)(1 << (*pbVar4 & 0x1f));
      *(undefined2 *)(in_RCX + 0x150 + (long)local_2c * 2) = 0;
    }
    else {
      WVar2 = ihevcd_sev((bitstrm_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
      ;
      *(short *)(in_RCX + 0x130 + (long)local_2c * 2) =
           (short)(1 << (*pbVar4 & 0x1f)) + (short)WVar2;
      WVar2 = ihevcd_sev((bitstrm_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
      ;
      *(short *)(in_RCX + 0x150 + (long)local_2c * 2) = (short)WVar2;
    }
    if (*(char *)(in_RCX + 0x120 + (long)local_2c) == '\0') {
      *(short *)(in_RCX + 0x170 + (long)local_2c * 2) =
           (short)(1 << (*(byte *)(in_RCX + 0x10f) & 0x1f));
      *(short *)(in_RCX + 0x1b0 + (long)local_2c * 2) =
           (short)(1 << (*(byte *)(in_RCX + 0x10f) & 0x1f));
      *(undefined2 *)(in_RCX + 400 + (long)local_2c * 2) = 0;
      *(undefined2 *)(in_RCX + 0x1d0 + (long)local_2c * 2) = 0;
    }
    else {
      WVar2 = ihevcd_sev((bitstrm_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
      ;
      *(short *)(in_RCX + 0x170 + (long)local_2c * 2) =
           (short)(1 << (*(byte *)(in_RCX + 0x10f) & 0x1f)) + (short)WVar2;
      WVar2 = ihevcd_sev((bitstrm_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
      ;
      iVar3 = (WVar2 - (*(short *)(in_RCX + 0x170 + (long)local_2c * 2) * 0x80 >>
                       (*(byte *)(in_RCX + 0x10f) & 0x1f))) + 0x80;
      if (iVar3 < 0x80) {
        if (iVar3 < -0x80) {
          iVar3 = -0x80;
        }
        uVar5 = (undefined2)iVar3;
      }
      else {
        uVar5 = 0x7f;
      }
      *(undefined2 *)(in_RCX + 400 + (long)local_2c * 2) = uVar5;
      WVar2 = ihevcd_sev((bitstrm_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
      ;
      *(short *)(in_RCX + 0x1b0 + (long)local_2c * 2) =
           (short)(1 << (*(byte *)(in_RCX + 0x10f) & 0x1f)) + (short)WVar2;
      WVar2 = ihevcd_sev((bitstrm_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
      ;
      local_58 = (WVar2 - (*(short *)(in_RCX + 0x1b0 + (long)local_2c * 2) * 0x80 >>
                          (*(byte *)(in_RCX + 0x10f) & 0x1f))) + 0x80;
      if (local_58 < 0x80) {
        if (local_58 < -0x80) {
          local_58 = -0x80;
        }
        local_54 = (undefined2)local_58;
      }
      else {
        local_54 = 0x7f;
      }
      *(undefined2 *)(in_RCX + 0x1d0 + (long)local_2c * 2) = local_54;
    }
  }
  if (*(char *)(in_RCX + 0x50) == '\0') {
    for (local_2c = 0; local_2c < *(char *)(in_RCX + 0xa5); local_2c = local_2c + 1) {
      UVar1 = ihevcd_bits_get(in_RDI,1);
      *(char *)(in_RCX + 0x1f0 + (long)local_2c) = (char)UVar1;
    }
    if (*(char *)(in_RSI + 0xf) == '\0') {
      for (local_2c = 0; local_2c < *(char *)(in_RCX + 0xa5); local_2c = local_2c + 1) {
        *(undefined1 *)(in_RCX + 0x200 + (long)local_2c) = 0;
      }
    }
    else {
      for (local_2c = 0; local_2c < *(char *)(in_RCX + 0xa5); local_2c = local_2c + 1) {
        UVar1 = ihevcd_bits_get(in_RDI,1);
        *(char *)(in_RCX + 0x200 + (long)local_2c) = (char)UVar1;
      }
    }
    for (local_2c = 0; local_2c < *(char *)(in_RCX + 0xa5); local_2c = local_2c + 1) {
      if (*(char *)(in_RCX + 0x1f0 + (long)local_2c) == '\0') {
        *(short *)(in_RCX + 0x210 + (long)local_2c * 2) = (short)(1 << (*pbVar4 & 0x1f));
        *(undefined2 *)(in_RCX + 0x230 + (long)local_2c * 2) = 0;
      }
      else {
        WVar2 = ihevcd_sev((bitstrm_t *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        *(short *)(in_RCX + 0x210 + (long)local_2c * 2) =
             (short)(1 << (*pbVar4 & 0x1f)) + (short)WVar2;
        WVar2 = ihevcd_sev((bitstrm_t *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        *(short *)(in_RCX + 0x230 + (long)local_2c * 2) = (short)WVar2;
      }
      if (*(char *)(in_RCX + 0x200 + (long)local_2c) == '\0') {
        *(short *)(in_RCX + 0x250 + (long)local_2c * 2) =
             (short)(1 << (*(byte *)(in_RCX + 0x10f) & 0x1f));
        *(short *)(in_RCX + 0x290 + (long)local_2c * 2) =
             (short)(1 << (*(byte *)(in_RCX + 0x10f) & 0x1f));
        *(undefined2 *)(in_RCX + 0x270 + (long)local_2c * 2) = 0;
        *(undefined2 *)(in_RCX + 0x2b0 + (long)local_2c * 2) = 0;
      }
      else {
        in_stack_ffffffffffffffb8 = 0x80;
        WVar2 = ihevcd_sev((bitstrm_t *)CONCAT44(in_stack_ffffffffffffffbc,0x80));
        *(short *)(in_RCX + 0x250 + (long)local_2c * 2) =
             (short)(1 << (*(byte *)(in_RCX + 0x10f) & 0x1f)) + (short)WVar2;
        WVar2 = ihevcd_sev((bitstrm_t *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        iVar3 = (WVar2 - (in_stack_ffffffffffffffb8 *
                          *(short *)(in_RCX + 0x250 + (long)local_2c * 2) >>
                         (*(byte *)(in_RCX + 0x10f) & 0x1f))) + in_stack_ffffffffffffffb8;
        if (iVar3 < 0x80) {
          local_60 = iVar3;
          if (iVar3 < -0x80) {
            local_60 = -0x80;
          }
          local_5c = (undefined2)local_60;
        }
        else {
          local_5c = 0x7f;
        }
        *(undefined2 *)(in_RCX + 0x270 + (long)local_2c * 2) = local_5c;
        WVar2 = ihevcd_sev((bitstrm_t *)CONCAT44(iVar3,in_stack_ffffffffffffffb8));
        *(short *)(in_RCX + 0x290 + (long)local_2c * 2) =
             (short)(1 << (*(byte *)(in_RCX + 0x10f) & 0x1f)) + (short)WVar2;
        WVar2 = ihevcd_sev((bitstrm_t *)CONCAT44(iVar3,in_stack_ffffffffffffffb8));
        in_stack_ffffffffffffffbc =
             (WVar2 - (in_stack_ffffffffffffffb8 * *(short *)(in_RCX + 0x290 + (long)local_2c * 2)
                      >> (*(byte *)(in_RCX + 0x10f) & 0x1f))) + in_stack_ffffffffffffffb8;
        if (in_stack_ffffffffffffffbc < 0x80) {
          local_68 = in_stack_ffffffffffffffbc;
          if (in_stack_ffffffffffffffbc < -0x80) {
            local_68 = -0x80;
          }
          local_64 = (undefined2)local_68;
        }
        else {
          local_64 = 0x7f;
        }
        *(undefined2 *)(in_RCX + 0x2b0 + (long)local_2c * 2) = local_64;
      }
    }
  }
  return 0;
}

Assistant:

WORD32 ihevcd_parse_pred_wt_ofst(bitstrm_t *ps_bitstrm,
                                 sps_t *ps_sps,
                                 pps_t *ps_pps,
                                 slice_header_t *ps_slice_hdr)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 value;
    WORD32 i;

    pred_wt_ofst_t *ps_wt_ofst = &ps_slice_hdr->s_wt_ofst;
    UNUSED(ps_pps);

    UEV_PARSE("luma_log2_weight_denom", value, ps_bitstrm);
    ps_wt_ofst->i1_luma_log2_weight_denom = value;

    if(ps_sps->i1_chroma_format_idc != 0)
    {
        SEV_PARSE("delta_chroma_log2_weight_denom", value, ps_bitstrm);
        ps_wt_ofst->i1_chroma_log2_weight_denom = ps_wt_ofst->i1_luma_log2_weight_denom + value;
    }

    for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l0_active; i++)
    {
        BITS_PARSE("luma_weight_l0_flag[ i ]", value, ps_bitstrm, 1);
        ps_wt_ofst->i1_luma_weight_l0_flag[i] = value;
    }



    if(ps_sps->i1_chroma_format_idc != 0)
    {
        for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l0_active; i++)
        {
            BITS_PARSE("chroma_weight_l0_flag[ i ]", value, ps_bitstrm, 1);
            ps_wt_ofst->i1_chroma_weight_l0_flag[i] = value;
        }
    }
    else
    {
        for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l0_active; i++)
        {
            ps_wt_ofst->i1_chroma_weight_l0_flag[i] = 0;
        }
    }


    for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l0_active; i++)
    {
        if(ps_wt_ofst->i1_luma_weight_l0_flag[i])
        {
            SEV_PARSE("delta_luma_weight_l0[ i ]", value, ps_bitstrm);


            ps_wt_ofst->i2_luma_weight_l0[i] = (1 << ps_wt_ofst->i1_luma_log2_weight_denom) + value;

            SEV_PARSE("luma_offset_l0[ i ]", value, ps_bitstrm);
            ps_wt_ofst->i2_luma_offset_l0[i] = value;

        }
        else
        {
            ps_wt_ofst->i2_luma_weight_l0[i] = (1 << ps_wt_ofst->i1_luma_log2_weight_denom);
            ps_wt_ofst->i2_luma_offset_l0[i] = 0;
        }
        if(ps_wt_ofst->i1_chroma_weight_l0_flag[i])
        {
            WORD32 ofst;
            WORD32 shift = (1 << (BIT_DEPTH_CHROMA - 1));
            SEV_PARSE("delta_chroma_weight_l0[ i ][ j ]", value, ps_bitstrm);
            ps_wt_ofst->i2_chroma_weight_l0_cb[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom) + value;


            SEV_PARSE("delta_chroma_offset_l0[ i ][ j ]", value, ps_bitstrm);
            ofst = ((shift * ps_wt_ofst->i2_chroma_weight_l0_cb[i]) >> ps_wt_ofst->i1_chroma_log2_weight_denom);
            ofst = value - ofst + shift;

            ps_wt_ofst->i2_chroma_offset_l0_cb[i] = CLIP_S8(ofst);

            SEV_PARSE("delta_chroma_weight_l0[ i ][ j ]", value, ps_bitstrm);
            ps_wt_ofst->i2_chroma_weight_l0_cr[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom) + value;


            SEV_PARSE("delta_chroma_offset_l0[ i ][ j ]", value, ps_bitstrm);
            ofst = ((shift * ps_wt_ofst->i2_chroma_weight_l0_cr[i]) >> ps_wt_ofst->i1_chroma_log2_weight_denom);
            ofst = value - ofst + shift;

            ps_wt_ofst->i2_chroma_offset_l0_cr[i] = CLIP_S8(ofst);

        }
        else
        {
            ps_wt_ofst->i2_chroma_weight_l0_cb[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom);
            ps_wt_ofst->i2_chroma_weight_l0_cr[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom);

            ps_wt_ofst->i2_chroma_offset_l0_cb[i] = 0;
            ps_wt_ofst->i2_chroma_offset_l0_cr[i] = 0;
        }
    }
    if(BSLICE == ps_slice_hdr->i1_slice_type)
    {
        for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l1_active; i++)
        {
            BITS_PARSE("luma_weight_l1_flag[ i ]", value, ps_bitstrm, 1);
            ps_wt_ofst->i1_luma_weight_l1_flag[i] = value;
        }

        if(ps_sps->i1_chroma_format_idc != 0)
        {
            for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l1_active; i++)
            {
                BITS_PARSE("chroma_weight_l1_flag[ i ]", value, ps_bitstrm, 1);
                ps_wt_ofst->i1_chroma_weight_l1_flag[i] = value;
            }
        }
        else
        {
            for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l1_active; i++)
            {
                ps_wt_ofst->i1_chroma_weight_l1_flag[i] = 0;
            }
        }

        for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l1_active; i++)
        {
            if(ps_wt_ofst->i1_luma_weight_l1_flag[i])
            {
                SEV_PARSE("delta_luma_weight_l1[ i ]", value, ps_bitstrm);


                ps_wt_ofst->i2_luma_weight_l1[i] = (1 << ps_wt_ofst->i1_luma_log2_weight_denom) + value;

                SEV_PARSE("luma_offset_l1[ i ]", value, ps_bitstrm);
                ps_wt_ofst->i2_luma_offset_l1[i] = value;

            }
            else
            {
                ps_wt_ofst->i2_luma_weight_l1[i] = (1 << ps_wt_ofst->i1_luma_log2_weight_denom);
                ps_wt_ofst->i2_luma_offset_l1[i] = 0;
            }

            if(ps_wt_ofst->i1_chroma_weight_l1_flag[i])
            {
                WORD32 ofst;
                WORD32 shift = (1 << (BIT_DEPTH_CHROMA - 1));
                SEV_PARSE("delta_chroma_weight_l1[ i ][ j ]", value, ps_bitstrm);
                ps_wt_ofst->i2_chroma_weight_l1_cb[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom) + value;;


                SEV_PARSE("delta_chroma_offset_l1[ i ][ j ]", value, ps_bitstrm);
                ofst = ((shift * ps_wt_ofst->i2_chroma_weight_l1_cb[i]) >> ps_wt_ofst->i1_chroma_log2_weight_denom);
                ofst = value - ofst + shift;

                ps_wt_ofst->i2_chroma_offset_l1_cb[i] = CLIP_S8(ofst);;

                SEV_PARSE("delta_chroma_weight_l1[ i ][ j ]", value, ps_bitstrm);
                ps_wt_ofst->i2_chroma_weight_l1_cr[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom) + value;


                SEV_PARSE("delta_chroma_offset_l1[ i ][ j ]", value, ps_bitstrm);
                ofst = ((shift * ps_wt_ofst->i2_chroma_weight_l1_cr[i]) >> ps_wt_ofst->i1_chroma_log2_weight_denom);
                ofst = value - ofst + shift;

                ps_wt_ofst->i2_chroma_offset_l1_cr[i] = CLIP_S8(ofst);;

            }
            else
            {
                ps_wt_ofst->i2_chroma_weight_l1_cb[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom);
                ps_wt_ofst->i2_chroma_weight_l1_cr[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom);

                ps_wt_ofst->i2_chroma_offset_l1_cb[i] = 0;
                ps_wt_ofst->i2_chroma_offset_l1_cr[i] = 0;

            }
        }
    }
    return ret;
}